

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O1

void __thiscall QGesture::QGesture(QGesture *this,QObject *parent)

{
  QObjectPrivate *this_00;
  
  this_00 = (QObjectPrivate *)operator_new(0xa8);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QObjectPrivate_007f4580;
  *(undefined4 *)(this_00 + 0x78) = 0x100;
  *(undefined8 *)(this_00 + 0x7c) = 0;
  *(undefined8 *)(this_00 + 0x84) = 0;
  *(undefined8 *)(this_00 + 0x8c) = 0;
  *(undefined8 *)(this_00 + 0x94) = 0;
  *(undefined4 *)(this_00 + 0x9c) = 0;
  this_00[0xa0] = (QObjectPrivate)((byte)this_00[0xa0] & 0xf8);
  QObject::QObject(&this->super_QObject,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_007f3f90;
  *(undefined4 *)(*(long *)&this->field_0x8 + 0x78) = 0x100;
  return;
}

Assistant:

QGesture::QGesture(QObject *parent)
    : QObject(*new QGesturePrivate, parent)
{
    d_func()->gestureType = Qt::CustomGesture;
}